

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3InsertTerms(Fts3Table *p,int iLangid,sqlite3_value **apVal,u32 *aSz)

{
  int iVar1;
  long in_RCX;
  long in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  int rc;
  char *zText;
  int iCol;
  int i;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_2c = 2;
  do {
    if (*(int *)(in_RDI + 0x30) + 2 <= local_2c) {
      return 0;
    }
    if (*(char *)(*(long *)(in_RDI + 0x40) + (long)(local_2c + -2)) == '\0') {
      sqlite3_value_text((sqlite3_value *)0x2543b3);
      iVar1 = fts3PendingTermsAdd(_iCol,zText._4_4_,in_stack_00000008,unaff_retaddr,
                                  (u32 *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8));
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = sqlite3_value_bytes((sqlite3_value *)0x254408);
      *(int *)(in_RCX + (long)*(int *)(in_RDI + 0x30) * 4) =
           iVar1 + *(int *)(in_RCX + (long)*(int *)(in_RDI + 0x30) * 4);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

static int fts3InsertTerms(
  Fts3Table *p,
  int iLangid,
  sqlite3_value **apVal,
  u32 *aSz
){
  int i;                          /* Iterator variable */
  for(i=2; i<p->nColumn+2; i++){
    int iCol = i-2;
    if( p->abNotindexed[iCol]==0 ){
      const char *zText = (const char *)sqlite3_value_text(apVal[i]);
      int rc = fts3PendingTermsAdd(p, iLangid, zText, iCol, &aSz[iCol]);
      if( rc!=SQLITE_OK ){
        return rc;
      }
      aSz[p->nColumn] += sqlite3_value_bytes(apVal[i]);
    }
  }
  return SQLITE_OK;
}